

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewSymbolTreeVisitor.cpp
# Opt level: O3

void __thiscall
NewSymbolTreeVisitor::Visit(NewSymbolTreeVisitor *this,MethodInvocation *method_invocation)

{
  symbol_table_t *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  MethodExpression *pMVar3;
  int iVar4;
  mapped_type *pmVar5;
  iterator iVar6;
  runtime_error *this_01;
  Symbol class_name;
  Symbol local_f0;
  key_type local_d0;
  string local_b0;
  string local_90;
  string local_70;
  Symbol local_50;
  
  paVar1 = &local_d0.name_.field_2;
  local_d0.name_._M_string_length = 0;
  local_d0.name_.field_2._M_local_buf[0] = '\0';
  local_d0.name_._M_dataplus._M_p = (pointer)paVar1;
  iVar4 = std::__cxx11::string::compare((char *)&method_invocation->call_from_);
  if (iVar4 == 0) {
    std::__cxx11::string::_M_assign((string *)&local_d0);
  }
  else {
    pcVar2 = (method_invocation->call_from_)._M_dataplus._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + (method_invocation->call_from_)._M_string_length)
    ;
    Symbol::Symbol(&local_f0,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    NewScopeLayer::GetVariableLayer(this->current_layer_,&local_f0);
    UserTypeResolving_abi_cxx11_(&local_70,this,&local_f0);
    Symbol::Symbol(&local_50,&local_70);
    std::__cxx11::string::_M_assign((string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.name_._M_dataplus._M_p != &local_50.name_.field_2) {
      operator_delete(local_50.name_._M_dataplus._M_p,
                      local_50.name_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.name_._M_dataplus._M_p != &local_f0.name_.field_2) {
      operator_delete(local_f0.name_._M_dataplus._M_p,
                      local_f0.name_.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = &(this->tree_).class_symbols_table_;
  pmVar5 = std::__detail::_Map_base<$a1ab393$>::operator[]
                     ((_Map_base<_a1ab393_> *)this_00,&local_d0);
  pcVar2 = (method_invocation->method_name_)._M_dataplus._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + (method_invocation->method_name_)._M_string_length)
  ;
  Symbol::Symbol(&local_f0,&local_b0);
  iVar6 = std::
          _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Method>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Method>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&(pmVar5->
                     super__Tuple_impl<0UL,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>
                     ).
                     super__Tuple_impl<1UL,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>
                     .
                     super__Head_base<1UL,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_false>
                 ,&local_f0);
  std::__detail::_Map_base<$a1ab393$>::operator[]((_Map_base<_a1ab393_> *)this_00,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.name_._M_dataplus._M_p != &local_f0.name_.field_2) {
    operator_delete(local_f0.name_._M_dataplus._M_p,local_f0.name_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (iVar6.super__Node_iterator_base<std::pair<const_Symbol,_std::shared_ptr<Method>_>,_true>.
      _M_cur != (__node_type *)0x0) {
    pMVar3 = method_invocation->arguments_list_;
    if (pMVar3 != (MethodExpression *)0x0) {
      (**(pMVar3->super_Node)._vptr_Node)(pMVar3,this);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.name_._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0.name_._M_dataplus._M_p,
                      CONCAT71(local_d0.name_.field_2._M_allocated_capacity._1_7_,
                               local_d0.name_.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Can\'t find method name");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void NewSymbolTreeVisitor::Visit(MethodInvocation* method_invocation) {
  Symbol class_name;
  if (method_invocation->call_from_ == "this") {
    class_name = current_layer_->class_symbol_;
  } else {
    const Symbol& symbol = Symbol(method_invocation->call_from_);

    current_layer_->GetVariableLayer(symbol);

    class_name = Symbol(UserTypeResolving(symbol));
  }

  if (std::get<1>(tree_.class_symbols_table_[class_name])
          .find(Symbol(method_invocation->method_name_)) ==
      std::get<1>(tree_.class_symbols_table_[class_name]).end()) {
    throw std::runtime_error("Can't find method name");
  }

  if (method_invocation->arguments_list_) {
    method_invocation->arguments_list_->Accept(this);
  }
}